

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DefaultCollationSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  string parameter;
  string local_50;
  string local_30;
  
  Value::ToString_abi_cxx11_(&local_30,input);
  StringUtil::Lower(&local_50,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::_M_assign((string *)&(config->options).collation);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void DefaultCollationSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());
	config.options.collation = parameter;
}